

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall AllocatorTest_allocator_ref_Test::TestBody(AllocatorTest_allocator_ref_Test *this)

{
  mock_allocator<int> *alloc_00;
  char *message;
  AssertHelper local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  test_allocator_ref ref;
  AssertionResult gtest_ar;
  test_allocator_ref ref3;
  test_allocator_ref ref2;
  StrictMock<mock_allocator<int>_> alloc;
  
  testing::StrictMock<mock_allocator<int>_>::StrictMock(&alloc);
  alloc_00 = &alloc.super_mock_allocator<int>;
  ref.alloc_ = alloc_00;
  check_forwarding(alloc_00,&ref);
  ref2 = ref;
  check_forwarding(alloc_00,&ref2);
  ref3.alloc_ = (mock_allocator<int> *)0x0;
  testing::internal::EqHelper<true>::Compare<mock_allocator<int>>
            ((EqHelper<true> *)&gtest_ar,"nullptr","ref3.get()",(Secret *)0x0,
             (mock_allocator<int> *)0x0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x118,message);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_128);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ref3 = ref;
  check_forwarding(alloc_00,&ref3);
  testing::StrictMock<mock_allocator<int>_>::~StrictMock(&alloc);
  return;
}

Assistant:

TEST(AllocatorTest, allocator_ref) {
  StrictMock< mock_allocator<int> > alloc;
  typedef allocator_ref< mock_allocator<int> > test_allocator_ref;
  test_allocator_ref ref(&alloc);
  // Check if allocator_ref forwards to the underlying allocator.
  check_forwarding(alloc, ref);
  test_allocator_ref ref2(ref);
  check_forwarding(alloc, ref2);
  test_allocator_ref ref3;
  EXPECT_EQ(FMT_NULL, ref3.get());
  ref3 = ref;
  check_forwarding(alloc, ref3);
}